

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O3

MortonCode64 __thiscall Resorting::MortonCode64::operator+(MortonCode64 *this,MortonCode64 rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = this->data ^ 0x7000000000000000;
  uVar3 = rhs.data ^ 0x7000000000000000;
  uVar2 = xMask * 2;
  uVar1 = xMask * 4;
  return (MortonCode64)
         (((~uVar1 | uVar4) + (uVar3 & uVar1) & uVar1 |
          (uVar2 & uVar3) + (~uVar2 | uVar4) & uVar2 | (xMask & uVar3) + (~xMask | uVar4) & xMask) ^
         0x7000000000000000);
}

Assistant:

MortonCode64 MortonCode64::operator+(const MortonCode64 rhs) const
{
    // invert sign bits
    uint64_t code1 = data ^ 0x7000000000000000;
    uint64_t code2 = rhs.data ^ 0x7000000000000000;

    uint64_t yMask = xMask << 1;
    uint64_t zMask = xMask << 2;

    uint64_t xSum = (code1 | ~xMask) + (code2 & xMask);
    uint64_t ySum = (code1 | ~yMask) + (code2 & yMask);
    uint64_t zSum = (code1 | ~zMask) + (code2 & zMask);

    uint64_t result = (xSum & xMask) | (ySum & yMask) | (zSum & zMask);
    return MortonCode64(result ^ 0x7000000000000000);
}